

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

MDDOpts FlatZinc::anon_unknown_4::getMDDOpts(Node *ann)

{
  MDDOpts MVar1;
  bool bVar2;
  Array *pAVar3;
  reference ppNVar4;
  Node *in_RDI;
  Atom *at;
  Node **i;
  iterator __end4;
  iterator __begin4;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *__range4;
  Array *args;
  MDDOpts mopts;
  string *in_stack_fffffffffffffef8;
  MDDOpts *in_stack_ffffffffffffff00;
  string *id;
  Node *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Node *in_stack_ffffffffffffff58;
  __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
  local_90;
  vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *local_88;
  allocator local_79;
  string local_78 [32];
  Array *local_58;
  undefined1 local_39 [33];
  Node *local_18;
  MDDOpts local_c;
  
  local_18 = in_RDI;
  MDDOpts::MDDOpts(&local_c);
  if (local_18 != (Node *)0x0) {
    id = (string *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_39 + 1),"mdd",(allocator *)id);
    bVar2 = AST::Node::hasCall(in_stack_ffffffffffffff48,id);
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"mdd",&local_79);
      AST::Node::getCall(in_stack_ffffffffffffff58,
                         (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      pAVar3 = AST::Node::getArray(local_18);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      local_88 = &pAVar3->a;
      local_58 = pAVar3;
      local_90._M_current =
           (Node **)std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::
                    begin((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                          in_stack_fffffffffffffef8);
      std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::end
                ((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                 in_stack_fffffffffffffef8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                                 *)in_stack_ffffffffffffff00,
                                (__normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                                 *)in_stack_fffffffffffffef8), bVar2) {
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
                  ::operator*(&local_90);
        if (*ppNVar4 == (Node *)0x0) {
          in_stack_ffffffffffffff00 = (MDDOpts *)0x0;
        }
        else {
          in_stack_ffffffffffffff00 =
               (MDDOpts *)__dynamic_cast(*ppNVar4,&AST::Node::typeinfo,&AST::Atom::typeinfo,0);
        }
        if (in_stack_ffffffffffffff00 != (MDDOpts *)0x0) {
          MDDOpts::parse_arg(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        __gnu_cxx::
        __normal_iterator<FlatZinc::AST::Node_**,_std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>_>
        ::operator++(&local_90);
      }
    }
  }
  MVar1.decomp = local_c.decomp;
  MVar1.expl_alg = local_c.expl_alg;
  MVar1.expl_strat = local_c.expl_strat;
  return MVar1;
}

Assistant:

inline MDDOpts getMDDOpts(AST::Node* ann) {
	MDDOpts mopts;
	if (ann != nullptr) {
		if (ann->hasCall("mdd")) {
			AST::Array* args(ann->getCall("mdd")->getArray());
			for (auto& i : args->a) {
				if (auto* at = dynamic_cast<AST::Atom*>(i)) {
					mopts.parse_arg(at->id);
				}
			}
		}
	}
	return mopts;
}